

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ska2anm.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  long *plVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint32 uVar6;
  int iVar7;
  undefined4 extraout_var;
  Animation *this;
  undefined4 extraout_var_00;
  long lVar8;
  char **ppcVar9;
  char cVar10;
  char *pcVar11;
  StreamFile local_38;
  
  ppcVar9 = argv;
  rw::Engine::init((Engine *)0x0,(EVP_PKEY_CTX *)argv);
  iVar7 = (int)ppcVar9;
  rw::registerHAnimPlugin();
  pcVar11 = (char *)0x0;
  rw::Engine::open((char *)0x0,iVar7);
  rw::Engine::start();
  if (argv0 == (char *)0x0) {
    argv0 = *argv;
  }
  while( true ) {
    ppcVar9 = argv + 1;
    iVar7 = argc + -1;
    pcVar3 = argv[1];
    if ((pcVar3 == (char *)0x0) || (*pcVar3 != '-')) break;
    pcVar11 = pcVar3 + 1;
    cVar10 = pcVar3[1];
    if (cVar10 == '-') {
      if (pcVar3[2] == '\0') {
        iVar7 = argc + -2;
        ppcVar9 = argv + 2;
        break;
      }
    }
    else if (cVar10 == '\0') break;
    while (argc = iVar7, argv = ppcVar9, cVar10 == 'v') {
      if (pcVar11[1] == '\0') {
        pcVar11 = argv[1];
        if (pcVar11 == (char *)0x0) goto LAB_001025b3;
        argv = argv + 1;
        argc = argc + -1;
      }
      else {
        pcVar11 = pcVar11 + 1;
      }
      __isoc99_sscanf(pcVar11,"%x",&rw::version);
      pcVar11 = "";
      ppcVar9 = argv;
      iVar7 = argc;
      cVar10 = '\0';
    }
    if (cVar10 != '\0') goto LAB_001025b3;
  }
  if (0 < iVar7) {
    local_38.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00142c08;
    local_38.file = (void *)0x0;
    iVar5 = rw::StreamFile::open(&local_38,*ppcVar9,0x12d03f);
    if (CONCAT44(extraout_var,iVar5) == 0) {
      pcVar11 = *ppcVar9;
    }
    else {
      uVar6 = rw::Stream::readU32(&local_38.super_Stream);
      iVar5 = 0;
      rw::StreamFile::seek(&local_38,0,0);
      if (uVar6 == 0x1b) {
        this = (Animation *)0x0;
        iVar5 = 0x1b;
        bVar4 = rw::findChunk(&local_38.super_Stream,0x1b,(uint32 *)0x0,(uint32 *)0x0);
        if (bVar4) {
          this = rw::Animation::streamRead(&local_38.super_Stream);
        }
      }
      else {
        this = rw::Animation::streamReadLegacy(&local_38.super_Stream);
      }
      rw::StreamFile::close(&local_38,iVar5);
      if (this == (Animation *)0x0) {
        fwrite("Error: couldn\'t read anim file\n",0x1f,1,_stderr);
        return 1;
      }
      if (iVar7 == 1) {
        pcVar11 = "out.anm";
        if (uVar6 == 0x1b) {
          pcVar11 = "out.ska";
        }
      }
      else {
        pcVar11 = ppcVar9[1];
      }
      iVar7 = rw::StreamFile::open(&local_38,pcVar11,0x12d08b);
      if (CONCAT44(extraout_var_00,iVar7) != 0) {
        if (uVar6 == 0x1b) {
          rw::Animation::streamWriteLegacy(this,&local_38.super_Stream);
        }
        else {
          rw::Animation::streamWrite(this,&local_38.super_Stream);
        }
        rw::Animation::destroy(this);
        return 0;
      }
    }
    fprintf(_stderr,"Error: couldn\'t open %s\n",pcVar11);
    return 1;
  }
LAB_001025b3:
  usage();
  lVar8 = 0;
  do {
    if (lVar8 == 10) {
      return 0x1437c0;
    }
    lVar1 = lVar8 + 1;
    plVar2 = &rw::interpInfoList + lVar8;
    lVar8 = lVar1;
  } while (*plVar2 != 0);
  (&argv0)[lVar1] = pcVar11;
  return 0x1437c0;
}

Assistant:

int
main(int argc, char *argv[])
{
	rw::Engine::init();
	rw::registerHAnimPlugin();
	rw::Engine::open(nil);
	rw::Engine::start();

	ARGBEGIN{
	case 'v':
		sscanf(EARGF(usage()), "%x", &rw::version);
		break;
	default:
		usage();
	}